

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpContext.h
# Opt level: O3

bool __thiscall glslang::TPpContext::tMacroInput::endOfReplacementList(tMacroInput *this)

{
  MacroSymbol *pMVar1;
  
  pMVar1 = this->mac;
  return (ulong)(((long)(pMVar1->body).stream.
                        super_vector<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
                        .
                        super__Vector_base<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pMVar1->body).stream.
                        super_vector<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
                        .
                        super__Vector_base<glslang::TPpContext::TokenStream::Token,_glslang::pool_allocator<glslang::TPpContext::TokenStream::Token>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7) <=
         (pMVar1->body).currentPos;
}

Assistant:

bool endOfReplacementList() override { return mac->body.atEnd(); }